

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O2

u32 recalculate_min_match_len(deflate_freqs *freqs,u32 max_search_depth)

{
  u32 uVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = 0;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    uVar3 = uVar3 + freqs->litlen[lVar2];
  }
  uVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    uVar1 = uVar1 + (uVar3 >> 10 < freqs->litlen[lVar2]);
  }
  uVar1 = choose_min_match_len(uVar1,max_search_depth);
  return uVar1;
}

Assistant:

static u32
recalculate_min_match_len(const struct deflate_freqs *freqs,
			  u32 max_search_depth)
{
	u32 literal_freq = 0;
	u32 cutoff;
	u32 num_used_literals = 0;
	int i;

	for (i = 0; i < DEFLATE_NUM_LITERALS; i++)
		literal_freq += freqs->litlen[i];

	cutoff = literal_freq >> 10; /* Ignore literals used very rarely. */

	for (i = 0; i < DEFLATE_NUM_LITERALS; i++) {
		if (freqs->litlen[i] > cutoff)
			num_used_literals++;
	}
	return choose_min_match_len(num_used_literals, max_search_depth);
}